

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZDICT_trainFromBuffer_legacy
                 (void *dictBuffer,size_t dictBufferCapacity,void *samplesBuffer,
                 size_t *samplesSizes,uint nbSamples,ZDICT_legacy_params_t params)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  undefined4 uVar5;
  ulong uVar3;
  ulong uVar6;
  uint acc;
  uint uVar7;
  uint uVar8;
  int iVar9;
  U32 UVar10;
  uint uVar11;
  uint extraout_EAX;
  uchar *T;
  dictItem *table;
  int *__ptr;
  void *pvVar12;
  void *__s;
  int *__ptr_00;
  ulong uVar13;
  clock_t cVar14;
  int *piVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  U32 *pUVar22;
  dictItem *pdVar23;
  ulong *puVar24;
  ulong *puVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  U32 l;
  uint uVar29;
  size_t sVar30;
  ulong uVar31;
  ulong uVar32;
  uint uVar33;
  int *SA;
  ulong uVar34;
  uchar uVar35;
  uint uVar36;
  ulong uVar37;
  char *pStart_2;
  ulong *puVar38;
  size_t sVar39;
  uint uVar40;
  ulong uVar41;
  bool bVar42;
  undefined1 auVar43 [16];
  dictItem elt;
  dictItem elt_00;
  dictItem elt_01;
  long local_380;
  uint local_348;
  U32 lengthList [64];
  uint local_238 [5];
  undefined4 local_224;
  uint local_220;
  uint auStack_21c [57];
  U32 cumulLength [64];
  
  if (nbSamples == 0) {
    uVar41 = 0;
  }
  else {
    uVar20 = 0;
    uVar41 = 0;
    do {
      uVar41 = uVar41 + samplesSizes[uVar20];
      uVar20 = uVar20 + 1;
    } while (nbSamples != uVar20);
  }
  if (uVar41 < 0x200) {
    return 0;
  }
  T = (uchar *)malloc(uVar41 + 0x20);
  if (T == (uchar *)0x0) {
    return 0xffffffffffffffc0;
  }
  memcpy(T,samplesBuffer,uVar41);
  uVar7 = 0x9e3779b1;
  lVar21 = 0;
  do {
    uVar7 = uVar7 * -0x7a143589;
    T[lVar21 + uVar41] = (uchar)(uVar7 >> 0x15);
    lVar21 = lVar21 + 1;
  } while (lVar21 != 0x20);
  uVar7 = (uint)(dictBufferCapacity >> 4);
  if (uVar7 < nbSamples) {
    uVar7 = nbSamples;
  }
  uVar41 = 10000;
  if (10000 < uVar7) {
    uVar41 = (ulong)uVar7;
  }
  table = (dictItem *)malloc(uVar41 * 0xc);
  uVar7 = 9;
  if (params.selectivityLevel != 0) {
    uVar7 = params.selectivityLevel;
  }
  uVar40 = 4;
  if (uVar7 < 0x1f) {
    uVar40 = nbSamples >> ((byte)uVar7 & 0x1f);
  }
  if (nbSamples == 0) {
    uVar20 = 0;
  }
  else {
    uVar27 = 0;
    uVar20 = 0;
    do {
      uVar20 = uVar20 + samplesSizes[uVar27];
      uVar27 = uVar27 + 1;
    } while (nbSamples != uVar27);
  }
  if (table == (dictItem *)0x0) {
    sVar39 = 0xffffffffffffffc0;
  }
  else {
    sVar30 = 0xffffffffffffffba;
    if ((0xff < dictBufferCapacity) && (sVar30 = 0xffffffffffffffde, 0x1ff < uVar20)) {
      table->pos = 1;
      table->length = 0;
      table->savings = 0xffffffff;
      __ptr = (int *)malloc(uVar20 * 4 + 8);
      pvVar12 = malloc(uVar20 * 4);
      __s = malloc(uVar20 + 0x10);
      __ptr_00 = (int *)malloc((ulong)nbSamples << 2);
      local_348 = params.zParams.notificationLevel;
      uVar8 = local_348;
      if (1 < local_348) {
        ZDICT_trainFromBuffer_legacy_cold_1();
        uVar8 = extraout_EAX;
      }
      auVar43._0_4_ = -(uint)((int)((ulong)__ptr >> 0x20) == 0 && (int)__ptr == 0);
      auVar43._4_4_ = -(uint)((int)pvVar12 == 0 && (int)((ulong)pvVar12 >> 0x20) == 0);
      auVar43._8_4_ = -(uint)((int)((ulong)__s >> 0x20) == 0 && (int)__s == 0);
      auVar43._12_4_ = -(uint)((int)__ptr_00 == 0 && (int)((ulong)__ptr_00 >> 0x20) == 0);
      iVar9 = movmskps(uVar8,auVar43);
      if (iVar9 == 0) {
        uVar8 = 4;
        if (4 < uVar40) {
          uVar8 = uVar40;
        }
        memset(__s,0,uVar20 + 0x10);
        if ((2 < local_348) && (0x7d000000 < uVar20)) {
          ZDICT_trainFromBuffer_legacy_cold_2();
        }
        uVar16 = (ulong)nbSamples;
        uVar27 = uVar20;
        if (0x7d000000 < uVar20) {
          uVar16 = (ulong)nbSamples;
          do {
            uVar16 = (ulong)((int)uVar16 - 1);
            uVar27 = uVar27 - samplesSizes[uVar16];
          } while (0x7d000000 < uVar27);
        }
        SA = __ptr + 1;
        uVar26 = local_348;
        if (1 < local_348) {
          ZDICT_trainFromBuffer_legacy_cold_3();
        }
        iVar17 = (int)uVar27;
        iVar9 = divsufsort(T,SA,iVar17,uVar26);
        if (iVar9 == 0) {
          __ptr[uVar27 + 1] = iVar17;
          *__ptr = iVar17;
          if (uVar27 != 0) {
            uVar13 = 0;
            do {
              *(int *)((long)pvVar12 + (long)SA[uVar13] * 4) = (int)uVar13;
              uVar13 = uVar13 + 1;
            } while (uVar27 != uVar13);
          }
          *__ptr_00 = 0;
          if (1 < (uint)uVar16) {
            iVar9 = *__ptr_00;
            lVar21 = 0;
            do {
              iVar9 = iVar9 + (int)samplesSizes[lVar21];
              __ptr_00[lVar21 + 1] = iVar9;
              lVar21 = lVar21 + 1;
            } while (uVar16 - 1 != lVar21);
          }
          if (1 < local_348) {
            ZDICT_trainFromBuffer_legacy_cold_4();
          }
          if (2 < local_348) {
            ZDICT_trainFromBuffer_legacy_cold_5();
          }
          if (uVar27 != 0) {
            local_380 = 0;
            uVar16 = 0;
            do {
              iVar9 = (int)uVar16;
              if (*(char *)((long)__s + uVar16) == '\0') {
                uVar26 = *(uint *)((long)pvVar12 + uVar16 * 4);
                memset(lengthList,0,0x100);
                memset(cumulLength,0,0x100);
                memset(local_238,0,0x100);
                lVar21 = (long)SA[uVar26];
                *(undefined1 *)((long)__s + lVar21) = 1;
                puVar38 = (ulong *)(T + lVar21);
                if (((*(short *)(T + lVar21) == *(short *)(T + lVar21 + 2)) ||
                    (*(short *)((long)puVar38 + 1) == *(short *)((long)puVar38 + 3))) ||
                   (*(short *)(T + lVar21 + 2) == *(short *)((long)puVar38 + 4))) {
                  iVar17 = -4;
                  uVar16 = 6;
                  do {
                    uVar13 = uVar16;
                    iVar17 = iVar17 + -2;
                    uVar16 = (ulong)((int)uVar13 + 2);
                  } while (*(short *)((long)puVar38 + uVar13) == *(short *)((long)puVar38 + 4));
                  if (iVar17 != 0) {
                    uVar26 = (uint)(*(char *)((long)puVar38 + uVar13) ==
                                   *(char *)((long)puVar38 + (uVar13 - 1))) - iVar17;
                    if (uVar26 < 3) {
                      uVar26 = 2;
                    }
                    memset((void *)((long)__s + lVar21 + 1),1,(ulong)(uVar26 - 1));
                  }
LAB_00190998:
                  uVar26 = 0;
                  uVar16 = 0;
                  uVar37 = 0;
                }
                else {
                  uVar16 = (ulong)uVar26;
                  iVar17 = 1;
                  do {
                    iVar19 = iVar17;
                    uVar11 = (int)uVar16 + 1;
                    uVar16 = (ulong)uVar11;
                    puVar24 = (ulong *)(T + SA[uVar16]);
                    puVar25 = puVar38;
                    do {
                      uVar13 = *puVar24;
                      uVar32 = *puVar25;
                      uVar37 = uVar32 ^ uVar13;
                      uVar28 = 0;
                      if (uVar37 != 0) {
                        for (; (uVar37 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                        }
                      }
                      uVar28 = (long)puVar25 + ((uVar28 >> 3 & 0x1fffffff) - (long)puVar38);
                      puVar25 = puVar25 + 1;
                      puVar24 = puVar24 + 1;
                    } while (uVar13 == uVar32);
                    uVar13 = (ulong)uVar26;
                    iVar17 = iVar19 + 1;
                  } while (6 < uVar28);
                  do {
                    iVar17 = iVar19;
                    uVar32 = uVar13;
                    puVar24 = (ulong *)(T + __ptr[uVar26]);
                    puVar25 = puVar38;
                    do {
                      uVar13 = *puVar24;
                      uVar28 = *puVar25;
                      uVar31 = uVar28 ^ uVar13;
                      uVar37 = 0;
                      if (uVar31 != 0) {
                        for (; (uVar31 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                        }
                      }
                      uVar37 = (long)puVar25 + ((uVar37 >> 3 & 0x1fffffff) - (long)puVar38);
                      puVar25 = puVar25 + 1;
                      puVar24 = puVar24 + 1;
                    } while (uVar13 == uVar28);
                    uVar26 = (uVar26 - 1) + (uint)(uVar37 < 7);
                    uVar13 = (ulong)((int)uVar32 - 1);
                    iVar19 = iVar17 + 1;
                  } while (6 < uVar37);
                  if (uVar11 - uVar26 < uVar8) {
                    if (uVar26 < uVar11) {
                      piVar15 = SA + uVar32;
                      do {
                        *(undefined1 *)((long)__s + (long)*piVar15) = 1;
                        piVar15 = piVar15 + 1;
                        iVar17 = iVar17 + -1;
                      } while (iVar17 != 0);
                    }
                    goto LAB_00190998;
                  }
                  if (3 < local_348) {
                    ZDICT_trainFromBuffer_legacy_cold_6();
                  }
                  iVar17 = 7;
                  while( true ) {
                    uVar11 = 0;
                    uVar36 = 0;
                    uVar18 = uVar26;
                    uVar33 = uVar26;
                    if (uVar26 < (uint)uVar16) {
                      uVar28 = (ulong)uVar26;
                      uVar36 = 0;
                      uVar13 = (ulong)uVar26;
                      uVar32 = (ulong)uVar26;
                      uVar11 = 0;
                      uVar35 = '\0';
                      do {
                        if (T[(uint)(SA[uVar28] + iVar17)] != uVar35) {
                          if (uVar36 < uVar11) {
                            uVar13 = uVar32;
                            uVar36 = uVar11;
                          }
                          uVar11 = 0;
                          uVar32 = uVar28 & 0xffffffff;
                          uVar35 = T[(uint)(SA[uVar28] + iVar17)];
                        }
                        uVar33 = (uint)uVar13;
                        uVar18 = (uint)uVar32;
                        uVar11 = uVar11 + 1;
                        uVar28 = uVar28 + 1;
                      } while (uVar16 != uVar28);
                    }
                    if (uVar11 <= uVar36) {
                      uVar18 = uVar33;
                      uVar11 = uVar36;
                    }
                    if (uVar11 < uVar8) break;
                    iVar17 = iVar17 + 1;
                    uVar16 = (ulong)(uVar18 + uVar11);
                    uVar26 = uVar18;
                  }
                  uVar11 = SA[uVar26];
                  uVar16 = (ulong)uVar11;
                  memset(lengthList,0,0x100);
                  puVar38 = (ulong *)(T + (int)uVar11);
                  uVar13 = (ulong)uVar26;
                  do {
                    uVar36 = (int)uVar13 + 1;
                    uVar13 = (ulong)uVar36;
                    puVar24 = (ulong *)(T + SA[uVar13]);
                    puVar25 = puVar38;
                    do {
                      uVar32 = *puVar24;
                      uVar28 = *puVar25;
                      uVar31 = uVar28 ^ uVar32;
                      uVar37 = 0;
                      if (uVar31 != 0) {
                        for (; (uVar31 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                        }
                      }
                      uVar37 = (long)puVar25 + ((uVar37 >> 3 & 0x1fffffff) - (long)puVar38);
                      puVar25 = puVar25 + 1;
                      puVar24 = puVar24 + 1;
                    } while (uVar32 == uVar28);
                    uVar18 = 0x3f;
                    if (uVar37 < 0x3f) {
                      uVar18 = (uint)uVar37;
                    }
                    lengthList[uVar18] = lengthList[uVar18] + 1;
                  } while (6 < uVar37);
                  do {
                    uVar18 = uVar26;
                    if (uVar18 == 0) break;
                    puVar24 = (ulong *)(T + SA[uVar18 - 1]);
                    puVar25 = puVar38;
                    do {
                      uVar32 = *puVar24;
                      uVar28 = *puVar25;
                      uVar31 = uVar28 ^ uVar32;
                      uVar37 = 0;
                      if (uVar31 != 0) {
                        for (; (uVar31 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                        }
                      }
                      uVar37 = (long)puVar25 + ((uVar37 >> 3 & 0x1fffffff) - (long)puVar38);
                      puVar25 = puVar25 + 1;
                      puVar24 = puVar24 + 1;
                    } while (uVar32 == uVar28);
                    uVar26 = 0x3f;
                    if (uVar37 < 0x3f) {
                      uVar26 = (uint)uVar37;
                    }
                    lengthList[uVar26] = lengthList[uVar26] + 1;
                    uVar26 = uVar18 - 1;
                  } while (6 < uVar37);
                  memset(cumulLength,0,0x100);
                  cumulLength[0x3f] = lengthList[0x3f];
                  lVar21 = 0x3e;
                  UVar10 = lengthList[0x3f];
                  do {
                    UVar10 = UVar10 + lengthList[lVar21];
                    cumulLength[lVar21] = UVar10;
                    bVar42 = lVar21 != 0;
                    lVar21 = lVar21 + -1;
                  } while (bVar42);
                  uVar32 = 0x3f;
                  do {
                    uVar26 = (uint)uVar32;
                    if (uVar8 <= cumulLength[uVar32]) goto LAB_00190e33;
                    uVar32 = (ulong)(uVar26 - 1);
                  } while (7 < uVar26);
                  uVar32 = 6;
LAB_00190e33:
                  uVar28 = uVar32;
                  uVar26 = (int)uVar32 + 1;
                  do {
                    uVar33 = uVar26;
                    uVar37 = uVar28;
                    uVar29 = (uint)uVar37;
                    uVar28 = (ulong)(uVar29 - 1);
                    uVar26 = uVar33 - 1;
                  } while (*(char *)((long)puVar38 + (uVar37 - 2)) ==
                           *(char *)((long)puVar38 + (long)(int)uVar32 + -1));
                  if (uVar29 < 7) goto LAB_00190998;
                  local_224 = 0;
                  if (6 < (int)uVar29) {
                    uVar32 = 7;
                    uVar26 = local_220;
                    do {
                      uVar26 = uVar26 + ((int)uVar32 + -3) * lengthList[uVar32];
                      local_238[uVar32] = uVar26;
                      uVar32 = uVar32 + 1;
                    } while (uVar33 != uVar32);
                  }
                  if (3 < local_348) {
                    ZDICT_trainFromBuffer_legacy_cold_7();
                  }
                  uVar26 = local_238[uVar37];
                  if (uVar18 < uVar36) {
                    uVar32 = (ulong)uVar18;
                    do {
                      uVar36 = SA[uVar32];
                      uVar28 = (ulong)uVar36;
                      uVar18 = uVar29;
                      if (uVar28 != (long)(int)uVar11) {
                        puVar24 = (ulong *)(T + uVar28);
                        puVar25 = puVar38;
                        do {
                          uVar31 = *puVar24;
                          uVar3 = *puVar25;
                          uVar34 = uVar3 ^ uVar31;
                          uVar6 = 0;
                          if (uVar34 != 0) {
                            for (; (uVar34 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                            }
                          }
                          uVar18 = (((uint)(uVar6 >> 3) & 0x1fffffff) + (int)puVar25) - (int)puVar38
                          ;
                          puVar25 = puVar25 + 1;
                          puVar24 = puVar24 + 1;
                        } while (uVar31 == uVar3);
                        if (uVar29 < uVar18) {
                          uVar18 = uVar29;
                        }
                      }
                      if (uVar36 < uVar18 + uVar36) {
                        memset((void *)(uVar28 + (long)__s),1,(ulong)(uVar18 - 1) + 1);
                      }
                      uVar32 = uVar32 + 1;
                    } while (uVar32 != uVar13);
                  }
                  uVar37 = uVar37 << 0x20;
                }
                if (uVar37 == 0) {
                  uVar26 = iVar9 + 1;
                }
                else {
                  elt._0_8_ = uVar16 | uVar37;
                  elt.savings = uVar26;
                  UVar10 = ZDICT_tryMerge(table,elt,0,T);
                  if (UVar10 == 0) {
                    uVar11 = table->pos;
                    if ((uint)uVar41 <= table->pos) {
                      uVar11 = (uint)uVar41 - 1;
                    }
                    uVar16 = (ulong)(uVar11 - 1);
                    uVar36 = table[uVar16].savings;
                    uVar18 = uVar11;
                    while (uVar36 < uVar26) {
                      pdVar23 = table + uVar16;
                      table[uVar18].savings = pdVar23->savings;
                      UVar10 = pdVar23->length;
                      table[uVar18].pos = pdVar23->pos;
                      table[uVar18].length = UVar10;
                      uVar16 = (ulong)(uVar18 - 2);
                      uVar18 = uVar18 - 1;
                      uVar36 = table[uVar16].savings;
                    }
                    table[uVar18].pos = (int)elt._0_8_;
                    table[uVar18].length = (int)(elt._0_8_ >> 0x20);
                    table[uVar18].savings = uVar26;
                    table->pos = uVar11 + 1;
                  }
                  else {
                    uVar1 = table[UVar10].pos;
                    uVar4 = table[UVar10].length;
                    elt_00.length = uVar4;
                    elt_00.pos = uVar1;
                    elt_00.savings = table[UVar10].savings;
                    uVar26 = ZDICT_tryMerge(table,elt_00,UVar10,T);
                    uVar16 = (ulong)UVar10;
                    while (uVar26 != 0) {
                      uVar13 = (ulong)uVar26;
                      uVar11 = table->pos - 1;
                      if ((uint)uVar16 < uVar11) {
                        lVar21 = uVar11 - uVar16;
                        pdVar23 = table + uVar16;
                        do {
                          pdVar23->savings = pdVar23[1].savings;
                          UVar10 = pdVar23[1].length;
                          pdVar23->pos = pdVar23[1].pos;
                          pdVar23->length = UVar10;
                          pdVar23 = pdVar23 + 1;
                          lVar21 = lVar21 + -1;
                        } while (lVar21 != 0);
                      }
                      table->pos = table->pos - 1;
                      uVar2 = table[uVar13].pos;
                      uVar5 = table[uVar13].length;
                      elt_01.length = uVar5;
                      elt_01.pos = uVar2;
                      elt_01.savings = table[uVar13].savings;
                      uVar26 = ZDICT_tryMerge(table,elt_01,uVar26,T);
                      uVar16 = uVar13;
                    }
                  }
                  uVar26 = iVar9 + (int)(uVar37 >> 0x20);
                  if (1 < local_348) {
                    cVar14 = clock();
                    if (cVar14 - local_380 < 0x493e1) {
                      uVar16 = (ulong)uVar26;
                    }
                    else {
                      local_380 = clock();
                      fprintf(_stderr,"\r%4.2f %% \r",
                              ((double)uVar26 / (double)(long)uVar27) * 100.0);
                      fflush(_stderr);
                      if (3 < local_348) {
                        fflush(_stderr);
                      }
                      uVar16 = (ulong)uVar26;
                    }
                    goto LAB_00190b33;
                  }
                }
                uVar16 = (ulong)uVar26;
              }
              else {
                uVar16 = (ulong)(iVar9 + 1);
              }
LAB_00190b33:
            } while (uVar16 < uVar27);
          }
        }
      }
      free(__ptr);
      free(pvVar12);
      free(__s);
      free(__ptr_00);
      if (2 < local_348) {
        uVar8 = table->pos;
        uVar26 = 0x19;
        if (uVar8 < 0x19) {
          uVar26 = uVar8;
        }
        if ((ulong)uVar8 < 2) {
          ZDICT_trainFromBuffer_legacy_cold_8();
        }
        else {
          lVar21 = 0;
          do {
            lVar21 = lVar21 + 0xc;
          } while ((ulong)uVar8 * 0xc + -0xc != lVar21);
          fprintf(_stderr,"\n %u segments found, of total size %u \n",(ulong)(uVar8 - 1));
          fflush(_stderr);
          fprintf(_stderr,"list %u best segments \n",(ulong)(uVar26 - 1));
          fflush(_stderr);
          if (1 < uVar8) {
            pUVar22 = &table[1].savings;
            uVar41 = 1;
            do {
              uVar27 = (ulong)((dictItem *)(pUVar22 + -2))->pos;
              sVar30 = 0xffffffffffffffff;
              if (uVar20 < uVar27) goto LAB_00191042;
              uVar8 = pUVar22[-1];
              if (uVar20 < ((dictItem *)(pUVar22 + -2))->pos + uVar8) goto LAB_00191042;
              sVar39 = 0x28;
              if (uVar8 < 0x28) {
                sVar39 = (size_t)uVar8;
              }
              fprintf(_stderr,"%3u:%3u bytes at pos %8u, savings %7u bytes |",uVar41,(ulong)uVar8,
                      uVar27,(ulong)*pUVar22);
              fflush(_stderr);
              ZDICT_printHex(T + uVar27,sVar39);
              fwrite("| \n",3,1,_stderr);
              fflush(_stderr);
              uVar41 = uVar41 + 1;
              pUVar22 = pUVar22 + 3;
            } while (uVar26 != uVar41);
          }
        }
      }
      uVar8 = table->pos;
      uVar41 = (ulong)uVar8;
      uVar27 = 0;
      if (1 < uVar41) {
        lVar21 = 0;
        uVar27 = 0;
        do {
          uVar27 = (ulong)(uint)((int)uVar27 + *(int *)((long)&table[1].length + lVar21));
          lVar21 = lVar21 + 0xc;
        } while (uVar41 * 0xc + -0xc != lVar21);
      }
      if ((uint)uVar27 < 0x80) {
        free(table);
        sVar39 = 0xffffffffffffffde;
LAB_0019103a:
        bVar42 = false;
        sVar30 = 0;
      }
      else {
        if (uVar27 < dictBufferCapacity >> 2) {
          if ((1 < local_348) &&
             (ZDICT_trainFromBuffer_legacy_cold_9(), uVar20 < dictBufferCapacity * 10)) {
            ZDICT_trainFromBuffer_legacy_cold_10();
          }
          if ((1 < local_348) && (4 < uVar40)) {
            ZDICT_trainFromBuffer_legacy_cold_11();
          }
        }
        if ((1 < uVar7 && 8 < nbSamples) && dictBufferCapacity * 3 < uVar27) {
          do {
            uVar7 = uVar7 - 1;
          } while (nbSamples >> ((byte)uVar7 & 0x1f) < 5);
          if (1 < local_348) {
            ZDICT_trainFromBuffer_legacy_cold_12();
          }
        }
        uVar20 = 0;
        if (uVar8 < 2) {
          uVar7 = 1;
        }
        else {
          pUVar22 = &table[1].length;
          uVar27 = 1;
          do {
            uVar7 = *pUVar22 + (uint)uVar20;
            uVar40 = (uint)uVar20;
            if (dictBufferCapacity < uVar7) goto LAB_00190749;
            uVar27 = uVar27 + 1;
            pUVar22 = pUVar22 + 3;
            uVar20 = (ulong)uVar7;
          } while (uVar41 != uVar27);
          uVar27 = (ulong)uVar8;
          uVar40 = uVar7;
LAB_00190749:
          uVar7 = (uint)uVar27;
          uVar20 = (ulong)uVar40;
        }
        table->pos = uVar7;
        if (1 < uVar7) {
          pvVar12 = (void *)((long)dictBuffer + dictBufferCapacity);
          pUVar22 = &table[1].length;
          uVar41 = 1;
          do {
            pvVar12 = (void *)((long)pvVar12 - (ulong)*pUVar22);
            if (pvVar12 < dictBuffer) {
              free(table);
              sVar39 = 0xffffffffffffffff;
              goto LAB_0019103a;
            }
            memcpy(pvVar12,T + ((dictItem *)(pUVar22 + -1))->pos,(ulong)*pUVar22);
            uVar41 = uVar41 + 1;
            pUVar22 = pUVar22 + 3;
          } while (uVar41 < table->pos);
        }
        lengthList[0] = params.zParams.compressionLevel;
        lengthList[2] = params.zParams.dictID;
        lengthList[1] = local_348;
        sVar30 = ZDICT_addEntropyTablesFromBuffer_advanced
                           (dictBuffer,uVar20,dictBufferCapacity,T,samplesSizes,nbSamples,
                            params.zParams);
        sVar39 = 0xffffffffffffffff;
        bVar42 = true;
      }
      if (!bVar42) goto LAB_0019104d;
    }
LAB_00191042:
    free(table);
    sVar39 = sVar30;
  }
LAB_0019104d:
  free(T);
  return sVar39;
}

Assistant:

size_t ZDICT_trainFromBuffer_legacy(void* dictBuffer, size_t dictBufferCapacity,
                              const void* samplesBuffer, const size_t* samplesSizes, unsigned nbSamples,
                              ZDICT_legacy_params_t params)
{
    size_t result;
    void* newBuff;
    size_t const sBuffSize = ZDICT_totalSampleSize(samplesSizes, nbSamples);
    if (sBuffSize < ZDICT_MIN_SAMPLES_SIZE) return 0;   /* not enough content => no dictionary */

    newBuff = malloc(sBuffSize + NOISELENGTH);
    if (!newBuff) return ERROR(memory_allocation);

    memcpy(newBuff, samplesBuffer, sBuffSize);
    ZDICT_fillNoise((char*)newBuff + sBuffSize, NOISELENGTH);   /* guard band, for end of buffer condition */

    result =
        ZDICT_trainFromBuffer_unsafe_legacy(dictBuffer, dictBufferCapacity, newBuff,
                                            samplesSizes, nbSamples, params);
    free(newBuff);
    return result;
}